

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationbutton.cpp
# Opt level: O1

void __thiscall
QtMWidgets::NavigationButton::paintEvent(NavigationButton *this,QPaintEvent *param_1)

{
  Direction DVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint flags;
  int iVar6;
  NavigationButtonPrivate *this_00;
  uint uVar7;
  uint uVar8;
  QPainter p;
  QRect arrowRect;
  QString t;
  QStyleOption opt;
  undefined1 auStack_b8 [8];
  QRect local_b0;
  QRect local_a0;
  QString local_90;
  QString local_78;
  QStyleOption local_60 [64];
  
  QPainter::QPainter((QPainter *)auStack_b8,(QPaintDevice *)&this->field_0x10);
  QPainter::setRenderHint((RenderHint)auStack_b8,true);
  lVar2 = *(long *)&this->field_0x20;
  uVar8 = *(int *)(lVar2 + 0x1c) - *(int *)(lVar2 + 0x14);
  uVar7 = *(int *)(lVar2 + 0x20) - *(int *)(lVar2 + 0x18);
  local_b0._0_8_ = 0.0;
  local_b0.x2 = -1;
  local_b0.y2 = -1;
  local_a0.x1 = 0;
  local_a0.y1 = 0;
  local_a0.x2 = -1;
  local_a0.y2 = -1;
  iVar3 = FingerGeometry::width();
  iVar4 = FingerGeometry::height();
  iVar5 = (int)((double)((ulong)((double)iVar3 / 5.0) & 0x8000000000000000 | (ulong)DAT_0017c4f0) +
               (double)iVar3 / 5.0);
  iVar3 = (int)((double)((ulong)((double)iVar4 / 3.0) & 0x8000000000000000 | (ulong)DAT_0017c4f0) +
               (double)iVar4 / 3.0);
  iVar4 = uVar7 - iVar3;
  iVar4 = (iVar4 - (iVar4 + 1 >> 0x1f)) + 1 >> 1;
  DVar1 = ((this->d).d)->direction;
  if (DVar1 == Left) {
    iVar6 = uVar8 - iVar5;
    local_a0.y1 = 0;
    local_a0.x1 = iVar5 + 10;
    flags = 0x981;
    local_a0.x2 = uVar8;
  }
  else {
    flags = 0x980;
    if (DVar1 != Right) goto LAB_00157699;
    iVar6 = uVar8 - iVar5;
    local_a0.x1 = 0;
    local_a0.y1 = 0;
    flags = 0x982;
    local_a0.x2 = iVar6 - 10;
  }
  local_b0.y2 = iVar3 + iVar4 + -1;
  local_b0.x2 = uVar8;
  local_b0.y1 = iVar4;
  local_b0.x1 = iVar6 + 1;
  local_a0.y2 = uVar7;
LAB_00157699:
  QStyleOption::QStyleOption(local_60,1,0);
  QStyleOption::initFrom((QWidget *)local_60);
  this_00 = (NavigationButtonPrivate *)this;
  QAbstractButton::text();
  NavigationButtonPrivate::makeString(&local_78,this_00,&local_90,&local_a0,flags,local_60);
  if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,8);
    }
  }
  QPainter::setPen((QColor *)auStack_b8);
  QPainter::drawText((QRect *)auStack_b8,(int)&local_a0,(QString *)(ulong)flags,(QRect *)&local_78);
  if (((this->d).d)->direction == Left) {
    QPainter::rotate(180.0);
    local_90.d.d = (Data *)(double)(int)~uVar8;
    local_90.d.ptr = (char16_t *)(double)(int)~uVar7;
    QPainter::translate((QPointF *)auStack_b8);
  }
  drawArrow((QPainter *)auStack_b8,&local_b0,&((this->d).d)->color);
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,8);
    }
  }
  QStyleOption::~QStyleOption(local_60);
  QPainter::~QPainter((QPainter *)auStack_b8);
  return;
}

Assistant:

void
NavigationButton::paintEvent( QPaintEvent * )
{
	QPainter p( this );
	p.setRenderHint( QPainter::Antialiasing );

	const QRect r = rect();
	QRect arrowRect;
	QRect textRect;

	const int arrowWidth = qRound( (qreal) FingerGeometry::width() / 5.0 );
	const int arrowHeight = qRound( (qreal) FingerGeometry::height() / 3.0 );
	const int delta = ( r.height() - arrowHeight ) /2;

	int flags = Qt::TextSingleLine | Qt::TextShowMnemonic | Qt::AlignVCenter;

	switch( d->direction )
	{
		case Left :
		{
			arrowRect.setRect( r.width() - arrowWidth, r.y() + delta,
				arrowWidth, arrowHeight );

			textRect.setRect( r.x() + arrowWidth + c_offset, r.y(),
				r.width() - arrowWidth - c_offset, r.height() );

			flags |= Qt::AlignLeft;
		}
			break;

		case Right :
		{
			arrowRect.setRect( r.x() + r.width() - arrowWidth, r.y() + delta,
				arrowWidth, arrowHeight );

			textRect.setRect( r.x(), r.y(),
				r.width() - arrowWidth - c_offset, r.height() );

			flags |= Qt::AlignRight;
		}
			break;

		default :
			break;
	}

	QStyleOption opt;
	opt.initFrom( this );

	const QString t = d->makeString( text(), textRect, flags, opt );

	p.setPen( d->textColor );
	p.drawText( textRect, flags, t );

	if( d->direction == Left )
	{
		p.rotate( 180 );
		p.translate( - r.width(), - r.height() );
	}

	drawArrow( &p, arrowRect, d->color );
}